

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_blech32.c
# Opt level: O0

_Bool check_confidential_addr_segwit_to_ec_public_key_script(void)

{
  int iVar1;
  uchar local_48 [3];
  _Bool is_success;
  int ret;
  uchar pub_key [33];
  char *local_18;
  char *pub_key_str;
  
  local_18 = (char *)0x0;
  iVar1 = wally_confidential_addr_segwit_to_ec_public_key
                    (elements_script_blech32,"el",local_48,0x21);
  if (iVar1 == 0) {
    iVar1 = wally_hex_from_bytes(local_48,0x21,&local_18);
    if (iVar1 == 0) {
      iVar1 = strcmp(local_18,elements_confidential_key);
      wally_free_string(local_18);
      pub_key_str._7_1_ = iVar1 == 0;
    }
    else {
      pub_key_str._7_1_ = false;
    }
  }
  else {
    pub_key_str._7_1_ = false;
  }
  return pub_key_str._7_1_;
}

Assistant:

static bool check_confidential_addr_segwit_to_ec_public_key_script(void)
{
    char *pub_key_str = NULL;
    unsigned char pub_key[EC_PUBLIC_KEY_LEN];
    int ret;
    bool is_success = false;

    ret = wally_confidential_addr_segwit_to_ec_public_key(
        elements_script_blech32, "el", pub_key, EC_PUBLIC_KEY_LEN);
    if (ret != WALLY_OK)
        return false;

    ret = wally_hex_from_bytes(pub_key, EC_PUBLIC_KEY_LEN, &pub_key_str);
    if (ret != WALLY_OK)
        return false;

    if (strcmp(pub_key_str, elements_confidential_key) == 0)
        is_success = true;

    wally_free_string(pub_key_str);
    return is_success;
}